

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined4 uVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  undefined8 *puVar25;
  undefined8 *puVar26;
  float *pfVar27;
  float *pfVar28;
  undefined1 (*pauVar29) [32];
  int iVar30;
  float *pfVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  int m_5;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [28];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar48 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar63;
  float fVar69;
  undefined1 auVar67 [32];
  float fVar70;
  float fVar71;
  float fVar76;
  float fVar78;
  float fVar80;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  float fVar77;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar74 [32];
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar87 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  undefined1 in_ZMM7 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  Mat m_1;
  float tmp [4] [6] [8];
  Allocator *_allocator;
  int local_5a8;
  uint local_5a4;
  void *local_5a0;
  void *local_598;
  ulong local_590;
  void *local_588;
  int local_57c;
  void *local_578;
  void *local_570;
  void *local_568;
  void *local_560;
  int local_558;
  uint local_554;
  Mat local_550;
  long local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  void *local_4e8;
  void *local_4e0;
  Mat *local_4d8;
  int local_4cc;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  void *local_4a8;
  Mat local_4a0;
  Mat local_450;
  ulong local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  ulong local_3e8;
  Mat local_3e0;
  ulong local_398;
  Mat *local_390;
  void *local_388;
  long local_380;
  long local_378;
  ulong local_370;
  Mat *local_368;
  undefined1 local_360 [8];
  float fStack_358;
  int iStack_354;
  undefined8 uStack_350;
  float afStack_348 [2];
  Allocator *local_340;
  int iStack_338;
  float fStack_334;
  float afStack_330 [4];
  size_t local_320;
  float afStack_318 [6];
  float local_300 [12];
  undefined8 auStack_2d0 [2];
  float local_2c0 [8];
  undefined8 auStack_2a0 [12];
  undefined1 auStack_240 [96];
  undefined1 auStack_1e0 [192];
  undefined1 auStack_120 [192];
  undefined1 auStack_60 [48];
  undefined1 auVar49 [32];
  undefined1 auVar54 [32];
  undefined1 auVar62 [32];
  undefined1 auVar68 [32];
  
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar41._4_4_ = uVar3;
  auVar41._0_4_ = uVar1;
  auVar44._8_4_ = 3;
  auVar44._0_8_ = 0x300000003;
  auVar44._12_4_ = 3;
  auVar41._8_8_ = 0;
  auVar41 = vpaddd_avx(auVar41,auVar44);
  auVar44 = vpsrad_avx(auVar41,0x1f);
  auVar44 = vpsrld_avx(auVar44,0x1e);
  auVar41 = vpaddd_avx(auVar41,auVar44);
  auVar41 = vpsrad_avx(auVar41,2);
  uVar40 = top_blob->elempack * top_blob->c;
  uVar38 = auVar41._4_4_ * auVar41._0_4_;
  uVar35 = bottom_blob->elempack * bottom_blob->c;
  local_4d8 = top_blob;
  local_390 = bias;
  local_368 = AT;
  get_optimal_tile_mnk(uVar40,uVar38,uVar35,(int *)&local_554,(int *)&local_5a4,&local_5a8,nT);
  local_4cc = (int)(uVar40 + local_554 + -1) / (int)local_554;
  iVar34 = (int)(uVar38 + local_5a4 + -1) / (int)local_5a4;
  iVar39 = (int)(local_5a8 + uVar35 + -1) / local_5a8;
  iVar19 = local_5a8 * local_5a4;
  _allocator = opt->workspace_allocator;
  local_450.cstep = 0;
  local_450.data = (void *)0x0;
  local_450.refcount._0_4_ = 0;
  local_450.refcount._4_4_ = 0;
  local_450.elemsize = 0;
  local_450.elempack = 0;
  local_450.allocator = (Allocator *)0x0;
  local_450.dims = 0;
  local_450.w = 0;
  local_450.h = 0;
  local_450.d = 0;
  local_450.c = 0;
  local_4c8 = (ulong)uVar38;
  local_4b8 = (ulong)uVar35;
  local_398 = (ulong)uVar40;
  Mat::create(&local_450,iVar19,0x24,iVar39,iVar34,4,_allocator);
  iVar34 = iVar39 * iVar34;
  iVar19 = iVar19 * 0x24;
  if ((nT < 2) || (nT <= iVar34)) {
    local_320 = 0;
    local_360 = (undefined1  [8])0x0;
    fStack_358 = 0.0;
    iStack_354 = 0;
    uStack_350 = 0;
    afStack_348[0] = 0.0;
    local_340 = (Allocator *)0x0;
    iStack_338 = 0;
    fStack_334 = 0.0;
    afStack_330[0] = 0.0;
    afStack_330[1] = 0.0;
    afStack_330[2] = 0.0;
    Mat::create((Mat *)local_360,iVar19,1,nT,4,opt->workspace_allocator);
    if (0 < iVar34) {
      iVar19 = 0;
      do {
        local_5a0 = (void *)CONCAT44(local_5a0._4_4_,iVar19 / iVar39);
        iVar30 = local_5a4 * (iVar19 / iVar39);
        iVar15 = local_5a8 * (iVar19 % iVar39);
        uVar35 = (int)local_4c8 - iVar30;
        if ((int)local_5a4 < (int)uVar35) {
          uVar35 = local_5a4;
        }
        iVar20 = (int)local_4b8 - iVar15;
        if (local_5a8 < iVar20) {
          iVar20 = local_5a8;
        }
        iVar16 = get_omp_thread_num();
        local_550.data = (void *)((long)iVar16 * local_320 * uStack_350 + (long)local_360);
        local_550.refcount._0_4_ = 0;
        local_550.refcount._4_4_ = 0;
        local_550.elemsize = uStack_350;
        local_550.elempack = (int)afStack_348[0];
        local_550.allocator = local_340;
        local_550.w = (int)fStack_334;
        local_550.h = (int)afStack_330[0];
        local_550.d = 1;
        local_550.c = (int)afStack_330[1];
        local_550.dims = iStack_338 + -1;
        local_550.cstep =
             (uStack_350 * (long)(int)afStack_330[0] * (long)(int)fStack_334 + 0xf &
             0xfffffffffffffff0) / uStack_350;
        if (iStack_338 == 4) {
          local_550.cstep = (long)(int)afStack_330[0] * (long)(int)fStack_334;
        }
        conv3x3s1_winograd43_transform_input_tile
                  (bottom_blob,&local_550,iVar30,uVar35,iVar15,iVar20,(int)_allocator);
        local_4a0.cstep = (long)local_450.h * (long)local_450.w;
        local_4a0.data =
             (void *)((long)local_450.data +
                     (uint)(iVar19 % iVar39) * local_450.elemsize * local_4a0.cstep +
                     (long)(int)local_5a0 * local_450.cstep * local_450.elemsize);
        local_4a0.refcount._0_4_ = 0;
        local_4a0.refcount._4_4_ = 0;
        local_4a0.elemsize = local_450.elemsize;
        local_4a0.elempack = local_450.elempack;
        local_4a0.allocator = local_450.allocator;
        local_4a0.dims = 2;
        local_4a0.w = local_450.w;
        local_4a0.h = local_450.h;
        local_4a0.d = 1;
        local_4a0.c = 1;
        transpose_pack_B_tile(&local_550,&local_4a0,0x24,uVar35,iVar20,(int)local_4a0.cstep);
        piVar6 = (int *)CONCAT44(local_4a0.refcount._4_4_,local_4a0.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_4a0.allocator == (Allocator *)0x0) {
              if (local_4a0.data != (void *)0x0) {
                free(local_4a0.data);
              }
            }
            else {
              (*(local_4a0.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_4a0.cstep = 0;
        local_4a0.data = (void *)0x0;
        local_4a0.refcount._0_4_ = 0;
        local_4a0.refcount._4_4_ = 0;
        local_4a0.elemsize = 0;
        local_4a0.elempack = 0;
        local_4a0.dims = 0;
        local_4a0.w = 0;
        local_4a0.h = 0;
        local_4a0.d = 0;
        local_4a0.c = 0;
        piVar6 = (int *)CONCAT44(local_550.refcount._4_4_,local_550.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_550.allocator == (Allocator *)0x0) {
              if (local_550.data != (void *)0x0) {
                free(local_550.data);
              }
            }
            else {
              (*(local_550.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_550.cstep = 0;
        local_550.data = (void *)0x0;
        local_550.refcount._0_4_ = 0;
        local_550.refcount._4_4_ = 0;
        local_550.elemsize = 0;
        local_550.elempack = 0;
        local_550.dims = 0;
        local_550.w = 0;
        local_550.h = 0;
        local_550.d = 0;
        local_550.c = 0;
        iVar19 = iVar19 + 1;
      } while (iVar34 != iVar19);
    }
    piVar6 = (int *)CONCAT44(iStack_354,fStack_358);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_340 == (Allocator *)0x0) {
          if (local_360 != (undefined1  [8])0x0) {
            free((void *)local_360);
          }
        }
        else {
          (*local_340->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_320 = 0;
    local_360 = (undefined1  [8])0x0;
    fStack_358 = 0.0;
    iStack_354 = 0;
    uStack_350 = 0;
    afStack_348[0] = 0.0;
    local_340 = (Allocator *)0x0;
    iStack_338 = 0;
    fStack_334 = 0.0;
    afStack_330[0] = 0.0;
    afStack_330[1] = 0.0;
    afStack_330[2] = 0.0;
    Mat::create((Mat *)local_360,iVar19,4,opt->workspace_allocator);
    if (0 < iVar34) {
      iVar19 = 0;
      do {
        iVar15 = local_5a4 * (iVar19 / iVar39);
        iVar30 = local_5a8 * (iVar19 % iVar39);
        uVar35 = (int)local_4c8 - iVar15;
        if ((int)local_5a4 < (int)uVar35) {
          uVar35 = local_5a4;
        }
        iVar20 = (int)local_4b8 - iVar30;
        if (local_5a8 < iVar20) {
          iVar20 = local_5a8;
        }
        conv3x3s1_winograd43_transform_input_tile
                  (bottom_blob,(Mat *)local_360,iVar15,uVar35,iVar30,iVar20,(int)_allocator);
        local_550.cstep = (long)local_450.h * (long)local_450.w;
        local_550.data =
             (void *)((long)local_450.data +
                     (uint)(iVar19 % iVar39) * local_450.elemsize * local_550.cstep +
                     (long)(iVar19 / iVar39) * local_450.cstep * local_450.elemsize);
        local_550.refcount._0_4_ = 0;
        local_550.refcount._4_4_ = 0;
        local_550.elemsize = local_450.elemsize;
        local_550.elempack = local_450.elempack;
        local_550.allocator = local_450.allocator;
        local_550.dims = 2;
        local_550.w = local_450.w;
        local_550.h = local_450.h;
        local_550.d = 1;
        local_550.c = 1;
        transpose_pack_B_tile((Mat *)local_360,&local_550,0x24,uVar35,iVar20,(int)local_550.cstep);
        piVar6 = (int *)CONCAT44(local_550.refcount._4_4_,local_550.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_550.allocator == (Allocator *)0x0) {
              if (local_550.data != (void *)0x0) {
                free(local_550.data);
              }
            }
            else {
              (*(local_550.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_550.cstep = 0;
        local_550.data = (void *)0x0;
        local_550.refcount._0_4_ = 0;
        local_550.refcount._4_4_ = 0;
        local_550.elemsize = 0;
        local_550.elempack = 0;
        local_550.dims = 0;
        local_550.w = 0;
        local_550.h = 0;
        local_550.d = 0;
        local_550.c = 0;
        iVar19 = iVar19 + 1;
      } while (iVar34 != iVar19);
    }
    piVar6 = (int *)CONCAT44(iStack_354,fStack_358);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_340 == (Allocator *)0x0) {
          if (local_360 != (undefined1  [8])0x0) {
            free((void *)local_360);
          }
        }
        else {
          (*local_340->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_320 = 0;
  afStack_348[0] = 0.0;
  uStack_350 = 0;
  iStack_354 = 0;
  fStack_358 = 0.0;
  local_360 = (undefined1  [8])0x0;
  iStack_338 = 0;
  fStack_334 = 0.0;
  afStack_330[0] = 0.0;
  afStack_330[1] = 0.0;
  afStack_330[2] = 0.0;
  local_550.cstep = 0;
  local_550.data = (void *)0x0;
  local_550.refcount._0_4_ = 0;
  local_550.refcount._4_4_ = 0;
  local_550.elemsize = 0;
  local_550.elempack = 0;
  local_550.allocator = (Allocator *)0x0;
  local_550.dims = 0;
  local_550.w = 0;
  local_550.h = 0;
  local_550.d = 0;
  local_550.c = 0;
  Mat::create(&local_550,local_5a4 * local_554 * 0x24,1,nT,4,opt->workspace_allocator);
  if (0 < local_4cc) {
    local_558 = 0;
    do {
      uVar35 = local_554;
      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
      iVar19 = get_omp_thread_num();
      local_4a0.data =
           (void *)((long)iVar19 * local_550.cstep * local_550.elemsize + (long)local_550.data);
      local_4a0.refcount._0_4_ = 0;
      local_4a0.refcount._4_4_ = 0;
      local_4a0.elemsize = local_550.elemsize;
      local_4a0.elempack = local_550.elempack;
      local_4a0.allocator = local_550.allocator;
      local_4a0.w = local_550.w;
      local_4a0.h = local_550.h;
      local_4a0.d = 1;
      local_4a0.c = local_550.d;
      local_4a0.dims = local_550.dims + -1;
      local_4a0.cstep =
           (local_550.elemsize * (long)local_550.h * (long)local_550.w + 0xf & 0xfffffffffffffff0) /
           local_550.elemsize;
      if (local_550.dims == 4) {
        local_4a0.cstep = (long)local_550.h * (long)local_550.w;
      }
      uVar40 = uVar35 * local_558;
      local_4b0 = (ulong)uVar40;
      uVar38 = (int)local_398 - uVar40;
      if ((int)uVar35 < (int)uVar38) {
        uVar38 = uVar35;
      }
      auVar112 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      if (0 < (int)local_4c8) {
        local_508 = (long)(int)uVar40;
        local_370 = (ulong)uVar38;
        local_3e8 = (ulong)(int)uVar38;
        uVar18 = 0;
        do {
          uVar35 = (int)local_4c8 - (int)uVar18;
          if ((int)local_5a4 < (int)uVar35) {
            uVar35 = local_5a4;
          }
          uVar36 = (ulong)uVar35;
          auVar42._8_4_ = 0x3f3504f3;
          auVar42._0_8_ = 0x3f3504f33f3504f3;
          auVar42._12_4_ = 0x3f3504f3;
          auVar42._16_4_ = 0x3f3504f3;
          auVar42._20_4_ = 0x3f3504f3;
          auVar42._24_4_ = 0x3f3504f3;
          auVar114 = ZEXT3264(CONCAT428(0x3fb504f3,
                                        CONCAT424(0x3fb504f3,
                                                  CONCAT420(0x3fb504f3,
                                                            CONCAT416(0x3fb504f3,
                                                                      CONCAT412(0x3fb504f3,
                                                                                CONCAT48(0x3fb504f3,
                                                                                                                                                                                  
                                                  0x3fb504f33fb504f3)))))));
          auVar121 = ZEXT3264(CONCAT428(0x3f000000,
                                        CONCAT424(0x3f000000,
                                                  CONCAT420(0x3f000000,
                                                            CONCAT416(0x3f000000,
                                                                      CONCAT412(0x3f000000,
                                                                                CONCAT48(0x3f000000,
                                                                                                                                                                                  
                                                  0x3f0000003f000000)))))));
          auVar122 = ZEXT3264(CONCAT428(0x403504f3,
                                        CONCAT424(0x403504f3,
                                                  CONCAT420(0x403504f3,
                                                            CONCAT416(0x403504f3,
                                                                      CONCAT412(0x403504f3,
                                                                                CONCAT48(0x403504f3,
                                                                                                                                                                                  
                                                  0x403504f3403504f3)))))));
          local_500 = uVar18;
          local_4f0 = uVar36;
          if (0 < (int)local_4b8) {
            iVar19 = 0;
            do {
              uVar36 = local_4f0;
              iVar34 = (int)local_4b8 - iVar19;
              if (local_5a8 < iVar34) {
                iVar34 = local_5a8;
              }
              fStack_334 = (float)local_368->w;
              afStack_330[0] = (float)local_368->h;
              uStack_350 = local_368->elemsize;
              afStack_348[0] = (float)local_368->elempack;
              local_340 = local_368->allocator;
              local_320 = (long)(int)afStack_330[0] * (long)(int)fStack_334;
              local_360 = (undefined1  [8])
                          ((long)local_368->data +
                          uStack_350 * local_320 * (long)(iVar19 / local_5a8) +
                          (long)(int)((long)((ulong)(uint)((int)local_4b0 >> 0x1f) << 0x20 |
                                            local_4b0 & 0xffffffff) / (long)(int)local_554) *
                          local_368->cstep * uStack_350);
              fStack_358 = 0.0;
              iStack_354 = 0;
              iStack_338 = 2;
              afStack_330[1] = 1.4013e-45;
              afStack_330[2] = 1.4013e-45;
              local_3e0.cstep = (long)local_450.h * (long)local_450.w;
              local_3e0.data =
                   (void *)((long)local_450.data +
                           local_450.elemsize * local_3e0.cstep * (long)(iVar19 / local_5a8) +
                           (long)(int)((long)((ulong)(uint)((int)local_500 >> 0x1f) << 0x20 |
                                             local_500 & 0xffffffff) / (long)(int)local_5a4) *
                           local_450.cstep * local_450.elemsize);
              local_3e0.refcount._0_4_ = 0;
              local_3e0.refcount._4_4_ = 0;
              local_3e0.elemsize = local_450.elemsize;
              local_3e0.elempack = local_450.elempack;
              local_3e0.allocator = local_450.allocator;
              local_3e0.dims = 2;
              local_3e0.w = local_450.w;
              local_3e0.h = local_450.h;
              local_3e0.d = 1;
              local_3e0.c = 1;
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              gemm_transB_packed_tile
                        ((Mat *)local_360,&local_3e0,&local_4a0,0x24,uVar38,(int)local_4f0,iVar19,
                         iVar34);
              piVar6 = (int *)CONCAT44(local_3e0.refcount._4_4_,local_3e0.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_3e0.allocator == (Allocator *)0x0) {
                    if (local_3e0.data != (void *)0x0) {
                      free(local_3e0.data);
                    }
                  }
                  else {
                    (*(local_3e0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_3e0.cstep = 0;
              local_3e0.data = (void *)0x0;
              local_3e0.refcount._0_4_ = 0;
              local_3e0.refcount._4_4_ = 0;
              local_3e0.elemsize = 0;
              local_3e0.elempack = 0;
              local_3e0.dims = 0;
              local_3e0.w = 0;
              local_3e0.h = 0;
              local_3e0.d = 0;
              local_3e0.c = 0;
              piVar6 = (int *)CONCAT44(iStack_354,fStack_358);
              auVar42._8_4_ = 0x3f3504f3;
              auVar42._0_8_ = 0x3f3504f33f3504f3;
              auVar42._12_4_ = 0x3f3504f3;
              auVar42._16_4_ = 0x3f3504f3;
              auVar42._20_4_ = 0x3f3504f3;
              auVar42._24_4_ = 0x3f3504f3;
              auVar114 = ZEXT3264(CONCAT428(0x3fb504f3,
                                            CONCAT424(0x3fb504f3,
                                                      CONCAT420(0x3fb504f3,
                                                                CONCAT416(0x3fb504f3,
                                                                          CONCAT412(0x3fb504f3,
                                                                                    CONCAT48(
                                                  0x3fb504f3,0x3fb504f33fb504f3)))))));
              auVar121 = ZEXT3264(CONCAT428(0x3f000000,
                                            CONCAT424(0x3f000000,
                                                      CONCAT420(0x3f000000,
                                                                CONCAT416(0x3f000000,
                                                                          CONCAT412(0x3f000000,
                                                                                    CONCAT48(
                                                  0x3f000000,0x3f0000003f000000)))))));
              auVar122 = ZEXT3264(CONCAT428(0x403504f3,
                                            CONCAT424(0x403504f3,
                                                      CONCAT420(0x403504f3,
                                                                CONCAT416(0x403504f3,
                                                                          CONCAT412(0x403504f3,
                                                                                    CONCAT48(
                                                  0x403504f3,0x403504f3403504f3)))))));
              auVar112 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_340 == (Allocator *)0x0) {
                    if (local_360 != (undefined1  [8])0x0) {
                      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                      free((void *)local_360);
                      auVar112 = ZEXT1664(CONCAT412(0x3f000000,
                                                    CONCAT48(0x3f000000,0x3f0000003f000000)));
                      auVar122 = ZEXT3264(CONCAT428(0x403504f3,
                                                    CONCAT424(0x403504f3,
                                                              CONCAT420(0x403504f3,
                                                                        CONCAT416(0x403504f3,
                                                                                  CONCAT412(
                                                  0x403504f3,CONCAT48(0x403504f3,0x403504f3403504f3)
                                                  ))))));
                      auVar121 = ZEXT3264(CONCAT428(0x3f000000,
                                                    CONCAT424(0x3f000000,
                                                              CONCAT420(0x3f000000,
                                                                        CONCAT416(0x3f000000,
                                                                                  CONCAT412(
                                                  0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)
                                                  ))))));
                      auVar114 = ZEXT3264(CONCAT428(0x3fb504f3,
                                                    CONCAT424(0x3fb504f3,
                                                              CONCAT420(0x3fb504f3,
                                                                        CONCAT416(0x3fb504f3,
                                                                                  CONCAT412(
                                                  0x3fb504f3,CONCAT48(0x3fb504f3,0x3fb504f33fb504f3)
                                                  ))))));
                      auVar42._8_4_ = 0x3f3504f3;
                      auVar42._0_8_ = 0x3f3504f33f3504f3;
                      auVar42._12_4_ = 0x3f3504f3;
                      auVar42._16_4_ = 0x3f3504f3;
                      auVar42._20_4_ = 0x3f3504f3;
                      auVar42._24_4_ = 0x3f3504f3;
                    }
                  }
                  else {
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    (*local_340->_vptr_Allocator[3])();
                    auVar112 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)
                                                 ));
                    auVar122 = ZEXT3264(CONCAT428(0x403504f3,
                                                  CONCAT424(0x403504f3,
                                                            CONCAT420(0x403504f3,
                                                                      CONCAT416(0x403504f3,
                                                                                CONCAT412(0x403504f3
                                                                                          ,CONCAT48(
                                                  0x403504f3,0x403504f3403504f3)))))));
                    auVar121 = ZEXT3264(CONCAT428(0x3f000000,
                                                  CONCAT424(0x3f000000,
                                                            CONCAT420(0x3f000000,
                                                                      CONCAT416(0x3f000000,
                                                                                CONCAT412(0x3f000000
                                                                                          ,CONCAT48(
                                                  0x3f000000,0x3f0000003f000000)))))));
                    auVar114 = ZEXT3264(CONCAT428(0x3fb504f3,
                                                  CONCAT424(0x3fb504f3,
                                                            CONCAT420(0x3fb504f3,
                                                                      CONCAT416(0x3fb504f3,
                                                                                CONCAT412(0x3fb504f3
                                                                                          ,CONCAT48(
                                                  0x3fb504f3,0x3fb504f33fb504f3)))))));
                    auVar42._8_4_ = 0x3f3504f3;
                    auVar42._0_8_ = 0x3f3504f33f3504f3;
                    auVar42._12_4_ = 0x3f3504f3;
                    auVar42._16_4_ = 0x3f3504f3;
                    auVar42._20_4_ = 0x3f3504f3;
                    auVar42._24_4_ = 0x3f3504f3;
                  }
                }
              }
              local_320 = 0;
              auVar41 = ZEXT816(0);
              auVar44 = auVar41 << 0x40;
              local_360 = auVar44._0_8_;
              local_360 = (undefined1  [8])0x0;
              fStack_358 = auVar41._0_4_;
              fStack_358 = 0.0;
              iStack_354 = auVar44._0_4_;
              iStack_354 = 0;
              uStack_350 = auVar44._4_8_;
              afStack_348[0] = auVar41._4_4_;
              afStack_348[0] = 0.0;
              fStack_334 = auVar44._4_4_;
              fStack_334 = 0.0;
              afStack_330[2] = 0.0;
              iVar19 = iVar19 + local_5a8;
              iStack_338 = iStack_354;
              afStack_330[0] = fStack_358;
              afStack_330[1] = afStack_348[0];
            } while (iVar19 < (int)local_4b8);
          }
          iVar19 = local_4d8->w;
          iVar34 = local_4d8->elempack;
          iVar39 = local_4d8->h;
          uVar35 = (int)local_4d8->cstep * iVar34;
          local_408 = (ulong)uVar35;
          local_57c = iVar19 + 6;
          if (-1 < iVar19 + 3) {
            local_57c = iVar19 + 3;
          }
          local_57c = local_57c >> 2;
          pvVar9 = (void *)0x0;
          local_588 = local_390->data;
          iVar15 = (int)local_500;
          if (7 < (int)uVar38) {
            iVar30 = (int)uVar36;
            lVar32 = (long)(int)uVar35;
            lVar21 = (long)(int)(uVar35 * 2);
            lVar10 = (long)(int)(uVar35 * 3);
            local_5a0 = (void *)(long)(int)(uVar35 * 4);
            lVar11 = (long)(int)(uVar35 * 5);
            lVar12 = (long)(int)(uVar35 * 6);
            lVar13 = (long)(int)(uVar35 * 7);
            local_560 = (void *)(long)(iVar34 * iVar19);
            local_4e0 = (void *)((long)(iVar30 * 0x30) * 4);
            local_3f8 = (long)(iVar30 * 8) * 4;
            local_400 = (long)(iVar30 * 0x10) * 4;
            local_3f0 = CONCAT44(local_3f0._4_4_,iVar30 * 0x120);
            local_378 = (long)(iVar30 * 0x20) * 4;
            local_380 = (long)(iVar30 * 0x28) * 4;
            local_388 = (void *)((long)local_588 + local_508 * 4);
            local_4e8 = (void *)(uVar36 & 0xffffffff);
            local_4f8 = 0;
            pvVar9 = (void *)0x0;
            do {
              local_4a8 = pvVar9;
              if (local_588 == (void *)0x0) {
                fVar43 = 0.0;
                fVar63 = 0.0;
                fVar69 = 0.0;
                fVar106 = 0.0;
                fVar71 = 0.0;
                fVar76 = 0.0;
                fVar78 = 0.0;
                fVar80 = 0.0;
              }
              else {
                pfVar27 = (float *)((long)local_388 + (long)local_4a8 * 4);
                fVar69 = *pfVar27;
                fVar106 = pfVar27[1];
                fVar43 = pfVar27[2];
                fVar63 = pfVar27[3];
                fVar71 = pfVar27[4];
                fVar76 = pfVar27[5];
                fVar78 = pfVar27[6];
                fVar80 = pfVar27[7];
              }
              if (0 < (int)uVar36) {
                lVar14 = (long)(int)local_4f8;
                local_578 = (void *)(long)(((int)local_4b0 + (int)local_4a8) / iVar34);
                pvVar9 = (void *)0x0;
                pvVar7 = (void *)0x0;
                do {
                  local_568 = pvVar7;
                  local_570 = pvVar9;
                  iVar20 = iVar15 + (int)local_570;
                  lVar17 = (long)local_4a0.data + (long)local_568;
                  lVar24 = -0xc0;
                  auVar107 = in_ZMM7;
                  do {
                    auVar49 = *(undefined1 (*) [32])(lVar17 + local_3f8 + lVar14 * 4);
                    auVar54 = *(undefined1 (*) [32])(lVar17 + local_400 + lVar14 * 4);
                    auVar48 = *(undefined1 (*) [32])
                               (lVar17 + (long)(iVar30 * 0x18) * 4 + lVar14 * 4);
                    auVar74 = *(undefined1 (*) [32])(lVar17 + local_378 + lVar14 * 4);
                    fVar70 = auVar54._0_4_ + auVar49._0_4_;
                    fVar75 = auVar54._4_4_ + auVar49._4_4_;
                    fVar77 = auVar54._8_4_ + auVar49._8_4_;
                    fVar79 = auVar54._12_4_ + auVar49._12_4_;
                    fVar81 = auVar54._16_4_ + auVar49._16_4_;
                    fVar82 = auVar54._20_4_ + auVar49._20_4_;
                    fVar83 = auVar54._24_4_ + auVar49._24_4_;
                    fVar84 = auVar54._28_4_ + auVar49._28_4_;
                    fVar85 = auVar74._0_4_ + auVar48._0_4_;
                    fVar88 = auVar74._4_4_ + auVar48._4_4_;
                    fVar91 = auVar74._8_4_ + auVar48._8_4_;
                    fVar94 = auVar74._12_4_ + auVar48._12_4_;
                    fVar97 = auVar74._16_4_ + auVar48._16_4_;
                    fVar99 = auVar74._20_4_ + auVar48._20_4_;
                    fVar101 = auVar74._24_4_ + auVar48._24_4_;
                    fVar103 = auVar74._28_4_ + auVar48._28_4_;
                    auVar49 = vsubps_avx(auVar49,auVar54);
                    auVar54 = vsubps_avx(auVar48,auVar74);
                    pfVar27 = (float *)(lVar17 + lVar14 * 4);
                    auVar61._0_4_ = fVar70 + *pfVar27 + fVar85;
                    auVar61._4_4_ = fVar75 + pfVar27[1] + fVar88;
                    auVar61._8_4_ = fVar77 + pfVar27[2] + fVar91;
                    auVar61._12_4_ = fVar79 + pfVar27[3] + fVar94;
                    auVar61._16_4_ = fVar81 + pfVar27[4] + fVar97;
                    auVar61._20_4_ = fVar82 + pfVar27[5] + fVar99;
                    auVar61._24_4_ = fVar83 + pfVar27[6] + fVar101;
                    auVar61._28_4_ = fVar84 + pfVar27[7] + fVar103;
                    fVar86 = auVar114._0_4_;
                    auVar108._0_4_ = auVar54._0_4_ * fVar86;
                    fVar90 = auVar114._4_4_;
                    auVar108._4_4_ = auVar54._4_4_ * fVar90;
                    fVar93 = auVar114._8_4_;
                    auVar108._8_4_ = auVar54._8_4_ * fVar93;
                    fVar96 = auVar114._12_4_;
                    auVar108._12_4_ = auVar54._12_4_ * fVar96;
                    fVar105 = auVar114._16_4_;
                    auVar108._16_4_ = auVar54._16_4_ * fVar105;
                    fVar109 = auVar114._20_4_;
                    auVar108._20_4_ = auVar54._20_4_ * fVar109;
                    fVar110 = auVar114._24_4_;
                    auVar108._28_36_ = auVar107._28_36_;
                    auVar108._24_4_ = auVar54._24_4_ * fVar110;
                    in_ZMM7 = ZEXT3264(auVar108._0_32_);
                    auVar67._0_4_ = auVar108._0_4_ + auVar42._0_4_ * auVar49._0_4_;
                    auVar67._4_4_ = auVar108._4_4_ + auVar42._4_4_ * auVar49._4_4_;
                    auVar67._8_4_ = auVar108._8_4_ + auVar42._8_4_ * auVar49._8_4_;
                    auVar67._12_4_ = auVar108._12_4_ + auVar42._12_4_ * auVar49._12_4_;
                    auVar67._16_4_ = auVar108._16_4_ + auVar42._16_4_ * auVar49._16_4_;
                    auVar67._20_4_ = auVar108._20_4_ + auVar42._20_4_ * auVar49._20_4_;
                    auVar67._24_4_ = auVar108._24_4_ + auVar42._24_4_ * auVar49._24_4_;
                    auVar67._28_4_ = auVar107._28_4_ + auVar74._28_4_;
                    fVar113 = auVar121._0_4_;
                    fVar115 = auVar121._4_4_;
                    fVar116 = auVar121._8_4_;
                    fVar117 = auVar121._12_4_;
                    fVar118 = auVar121._16_4_;
                    fVar119 = auVar121._20_4_;
                    fVar120 = auVar121._24_4_;
                    auVar74._0_4_ = fVar85 + fVar85 + fVar113 * fVar70;
                    auVar74._4_4_ = fVar88 + fVar88 + fVar115 * fVar75;
                    auVar74._8_4_ = fVar91 + fVar91 + fVar116 * fVar77;
                    auVar74._12_4_ = fVar94 + fVar94 + fVar117 * fVar79;
                    auVar74._16_4_ = fVar97 + fVar97 + fVar118 * fVar81;
                    auVar74._20_4_ = fVar99 + fVar99 + fVar119 * fVar82;
                    auVar74._24_4_ = fVar101 + fVar101 + fVar120 * fVar83;
                    auVar74._28_4_ = fVar103 + fVar103 + fVar84;
                    pfVar27 = (float *)(lVar17 + local_380 + lVar14 * 4);
                    fVar70 = auVar122._0_4_;
                    fVar75 = auVar122._4_4_;
                    fVar77 = auVar122._8_4_;
                    fVar79 = auVar122._12_4_;
                    fVar81 = auVar122._16_4_;
                    fVar82 = auVar122._20_4_;
                    fVar83 = auVar122._24_4_;
                    auVar48._0_4_ = auVar49._0_4_ * 0.35355338 + *pfVar27 + fVar70 * auVar54._0_4_;
                    auVar48._4_4_ = auVar49._4_4_ * 0.35355338 + pfVar27[1] + fVar75 * auVar54._4_4_
                    ;
                    auVar48._8_4_ = auVar49._8_4_ * 0.35355338 + pfVar27[2] + fVar77 * auVar54._8_4_
                    ;
                    auVar48._12_4_ =
                         auVar49._12_4_ * 0.35355338 + pfVar27[3] + fVar79 * auVar54._12_4_;
                    auVar48._16_4_ =
                         auVar49._16_4_ * 0.35355338 + pfVar27[4] + fVar81 * auVar54._16_4_;
                    auVar48._20_4_ =
                         auVar49._20_4_ * 0.35355338 + pfVar27[5] + fVar82 * auVar54._20_4_;
                    auVar48._24_4_ =
                         auVar49._24_4_ * 0.35355338 + pfVar27[6] + fVar83 * auVar54._24_4_;
                    auVar48._28_4_ = auVar49._28_4_ + pfVar27[7] + auVar54._28_4_;
                    *(undefined1 (*) [32])((long)auStack_2a0 + lVar24) = auVar61;
                    *(undefined1 (*) [32])(auStack_1e0 + lVar24) = auVar67;
                    *(undefined1 (*) [32])(auStack_120 + lVar24) = auVar74;
                    *(undefined1 (*) [32])(auStack_60 + lVar24) = auVar48;
                    lVar17 = lVar17 + (long)local_4e0;
                    lVar24 = lVar24 + 0x20;
                    auVar107 = in_ZMM7;
                  } while (lVar24 != 0);
                  iVar16 = iVar20 % local_57c;
                  uVar40 = iVar20 / local_57c << 2;
                  pauVar29 = (undefined1 (*) [32])
                             ((long)local_4d8->data +
                             (long)(iVar16 * 4 * iVar34) * 4 +
                             (long)local_4d8->w * local_4d8->elemsize * (long)(int)uVar40 +
                             local_4d8->cstep * (long)local_578 * local_4d8->elemsize);
                  iVar22 = iVar16 * 4 + 1;
                  local_590 = CONCAT44(local_590._4_4_,iVar22);
                  iVar23 = iVar16 * 4 + 2;
                  local_598 = (void *)CONCAT44(local_598._4_4_,iVar23);
                  iVar20 = iVar16 * 4 + 3;
                  pfVar27 = local_2c0;
                  lVar17 = 0;
                  auVar122 = ZEXT3264(auVar122._0_32_);
                  auVar121 = ZEXT3264(auVar121._0_32_);
                  auVar114 = ZEXT3264(auVar114._0_32_);
                  do {
                    if ((int)(uVar40 | (uint)lVar17) < iVar39) {
                      auVar49 = *(undefined1 (*) [32])(pfVar27 + -0x20);
                      auVar54 = *(undefined1 (*) [32])(pfVar27 + -0x18);
                      auVar48 = *(undefined1 (*) [32])(pfVar27 + -0x10);
                      auVar74 = *(undefined1 (*) [32])(pfVar27 + -8);
                      fVar85 = auVar54._0_4_ + auVar49._0_4_;
                      fVar88 = auVar54._4_4_ + auVar49._4_4_;
                      fVar91 = auVar54._8_4_ + auVar49._8_4_;
                      fVar94 = auVar54._12_4_ + auVar49._12_4_;
                      fVar97 = auVar54._16_4_ + auVar49._16_4_;
                      fVar99 = auVar54._20_4_ + auVar49._20_4_;
                      fVar101 = auVar54._24_4_ + auVar49._24_4_;
                      fVar103 = auVar74._0_4_ + auVar48._0_4_;
                      fVar89 = auVar74._4_4_ + auVar48._4_4_;
                      fVar92 = auVar74._8_4_ + auVar48._8_4_;
                      fVar95 = auVar74._12_4_ + auVar48._12_4_;
                      fVar98 = auVar74._16_4_ + auVar48._16_4_;
                      fVar100 = auVar74._20_4_ + auVar48._20_4_;
                      fVar102 = auVar74._24_4_ + auVar48._24_4_;
                      fVar104 = auVar74._28_4_ + auVar48._28_4_;
                      auVar61 = vsubps_avx(auVar49,auVar54);
                      auVar74 = vsubps_avx(auVar48,auVar74);
                      in_ZMM7 = ZEXT3264(auVar74);
                      fVar84 = fVar80 + pfVar27[-0x21] + auVar54._28_4_ + auVar49._28_4_;
                      auVar64._0_4_ = fVar69 + pfVar27[-0x28] + fVar85 + fVar103;
                      auVar64._4_4_ = fVar106 + pfVar27[-0x27] + fVar88 + fVar89;
                      auVar64._8_4_ = fVar43 + pfVar27[-0x26] + fVar91 + fVar92;
                      auVar64._12_4_ = fVar63 + pfVar27[-0x25] + fVar94 + fVar95;
                      auVar68._16_4_ = fVar71 + pfVar27[-0x24] + fVar97 + fVar98;
                      auVar68._0_16_ = auVar64;
                      auVar68._20_4_ = fVar76 + pfVar27[-0x23] + fVar99 + fVar100;
                      auVar68._24_4_ = fVar78 + pfVar27[-0x22] + fVar101 + fVar102;
                      auVar68._28_4_ = fVar84 + fVar104;
                      fVar84 = fVar80 + fVar84;
                      auVar55._0_4_ =
                           fVar69 + auVar42._0_4_ * auVar61._0_4_ + fVar86 * auVar74._0_4_;
                      auVar55._4_4_ =
                           fVar106 + auVar42._4_4_ * auVar61._4_4_ + fVar90 * auVar74._4_4_;
                      auVar55._8_4_ =
                           fVar43 + auVar42._8_4_ * auVar61._8_4_ + fVar93 * auVar74._8_4_;
                      auVar55._12_4_ =
                           fVar63 + auVar42._12_4_ * auVar61._12_4_ + fVar96 * auVar74._12_4_;
                      auVar62._16_4_ =
                           fVar71 + auVar42._16_4_ * auVar61._16_4_ + fVar105 * auVar74._16_4_;
                      auVar62._0_16_ = auVar55;
                      auVar62._20_4_ =
                           fVar76 + auVar42._20_4_ * auVar61._20_4_ + fVar109 * auVar74._20_4_;
                      auVar62._24_4_ =
                           fVar78 + auVar42._24_4_ * auVar61._24_4_ + fVar110 * auVar74._24_4_;
                      auVar62._28_4_ = fVar84 + auVar48._28_4_;
                      auVar50._0_4_ = fVar113 * fVar85 + fVar69 + fVar103 + fVar103;
                      auVar50._4_4_ = fVar115 * fVar88 + fVar106 + fVar89 + fVar89;
                      auVar50._8_4_ = fVar116 * fVar91 + fVar43 + fVar92 + fVar92;
                      auVar50._12_4_ = fVar117 * fVar94 + fVar63 + fVar95 + fVar95;
                      auVar54._16_4_ = fVar118 * fVar97 + fVar71 + fVar98 + fVar98;
                      auVar54._0_16_ = auVar50;
                      auVar54._20_4_ = fVar119 * fVar99 + fVar76 + fVar100 + fVar100;
                      auVar54._24_4_ = fVar120 * fVar101 + fVar78 + fVar102 + fVar102;
                      auVar54._28_4_ = fVar84 + fVar80 + fVar104 + fVar104;
                      auVar45._0_4_ =
                           fVar69 + auVar61._0_4_ * 0.35355338 + *pfVar27 + fVar70 * auVar74._0_4_;
                      auVar45._4_4_ =
                           fVar106 + auVar61._4_4_ * 0.35355338 + pfVar27[1] +
                           fVar75 * auVar74._4_4_;
                      auVar45._8_4_ =
                           fVar43 + auVar61._8_4_ * 0.35355338 + pfVar27[2] + fVar77 * auVar74._8_4_
                      ;
                      auVar45._12_4_ =
                           fVar63 + auVar61._12_4_ * 0.35355338 + pfVar27[3] +
                           fVar79 * auVar74._12_4_;
                      auVar49._16_4_ =
                           fVar71 + auVar61._16_4_ * 0.35355338 + pfVar27[4] +
                           fVar81 * auVar74._16_4_;
                      auVar49._0_16_ = auVar45;
                      auVar49._20_4_ =
                           fVar76 + auVar61._20_4_ * 0.35355338 + pfVar27[5] +
                           fVar82 * auVar74._20_4_;
                      auVar49._24_4_ =
                           fVar78 + auVar61._24_4_ * 0.35355338 + pfVar27[6] +
                           fVar83 * auVar74._24_4_;
                      auVar49._28_4_ = fVar80 + auVar61._28_4_ + pfVar27[7] + 0.35355338;
                      auVar56 = auVar68._16_16_;
                      auVar46 = auVar62._16_16_;
                      auVar44 = auVar54._16_16_;
                      auVar41 = auVar49._16_16_;
                      if (iVar34 == 1) {
                        *(float *)*pauVar29 = auVar64._0_4_;
                        uVar4 = vextractps_avx(auVar64,1);
                        *(undefined4 *)(*pauVar29 + lVar32 * 4) = uVar4;
                        uVar4 = vextractps_avx(auVar64,2);
                        *(undefined4 *)(*pauVar29 + lVar21 * 4) = uVar4;
                        uVar4 = vextractps_avx(auVar64,3);
                        *(undefined4 *)(*pauVar29 + lVar10 * 4) = uVar4;
                        *(float *)(*pauVar29 + (long)local_5a0 * 4) = auVar68._16_4_;
                        uVar4 = vextractps_avx(auVar56,1);
                        *(undefined4 *)(*pauVar29 + lVar11 * 4) = uVar4;
                        uVar4 = vextractps_avx(auVar56,2);
                        *(undefined4 *)(*pauVar29 + lVar12 * 4) = uVar4;
                        uVar4 = vextractps_avx(auVar56,3);
                        *(undefined4 *)(*pauVar29 + lVar13 * 4) = uVar4;
                        if (iVar22 < iVar19) {
                          *(float *)(*pauVar29 + 4) = auVar55._0_4_;
                          uVar4 = vextractps_avx(auVar55,1);
                          *(undefined4 *)(*pauVar29 + lVar32 * 4 + 4) = uVar4;
                          uVar4 = vextractps_avx(auVar55,2);
                          *(undefined4 *)(*pauVar29 + lVar21 * 4 + 4) = uVar4;
                          uVar4 = vextractps_avx(auVar55,3);
                          *(undefined4 *)(*pauVar29 + lVar10 * 4 + 4) = uVar4;
                          *(float *)(*pauVar29 + (long)local_5a0 * 4 + 4) = auVar62._16_4_;
                          uVar4 = vextractps_avx(auVar46,1);
                          *(undefined4 *)(*pauVar29 + lVar11 * 4 + 4) = uVar4;
                          uVar4 = vextractps_avx(auVar46,2);
                          *(undefined4 *)(*pauVar29 + lVar12 * 4 + 4) = uVar4;
                          uVar4 = vextractps_avx(auVar46,3);
                          *(undefined4 *)(*pauVar29 + lVar13 * 4 + 4) = uVar4;
                        }
                        if (iVar23 < iVar19) {
                          *(float *)(*pauVar29 + 8) = auVar50._0_4_;
                          uVar4 = vextractps_avx(auVar50,1);
                          *(undefined4 *)(*pauVar29 + lVar32 * 4 + 8) = uVar4;
                          uVar4 = vextractps_avx(auVar50,2);
                          *(undefined4 *)(*pauVar29 + lVar21 * 4 + 8) = uVar4;
                          uVar4 = vextractps_avx(auVar50,3);
                          *(undefined4 *)(*pauVar29 + lVar10 * 4 + 8) = uVar4;
                          *(float *)(*pauVar29 + (long)local_5a0 * 4 + 8) = auVar54._16_4_;
                          uVar4 = vextractps_avx(auVar44,1);
                          *(undefined4 *)(*pauVar29 + lVar11 * 4 + 8) = uVar4;
                          uVar4 = vextractps_avx(auVar44,2);
                          *(undefined4 *)(*pauVar29 + lVar12 * 4 + 8) = uVar4;
                          uVar4 = vextractps_avx(auVar44,3);
                          *(undefined4 *)(*pauVar29 + lVar13 * 4 + 8) = uVar4;
                        }
                        if (iVar20 < iVar19) {
                          *(float *)(*pauVar29 + 0xc) = auVar45._0_4_;
                          uVar4 = vextractps_avx(auVar45,1);
                          *(undefined4 *)(*pauVar29 + lVar32 * 4 + 0xc) = uVar4;
                          uVar4 = vextractps_avx(auVar45,2);
                          *(undefined4 *)(*pauVar29 + lVar21 * 4 + 0xc) = uVar4;
                          uVar4 = vextractps_avx(auVar45,3);
                          *(undefined4 *)(*pauVar29 + lVar10 * 4 + 0xc) = uVar4;
                          *(float *)(*pauVar29 + (long)local_5a0 * 4 + 0xc) = auVar49._16_4_;
                          uVar4 = vextractps_avx(auVar41,1);
                          *(undefined4 *)(*pauVar29 + lVar11 * 4 + 0xc) = uVar4;
                          uVar4 = vextractps_avx(auVar41,2);
                          *(undefined4 *)(*pauVar29 + lVar12 * 4 + 0xc) = uVar4;
                          uVar4 = vextractps_avx(auVar41,3);
                          *(undefined4 *)(*pauVar29 + lVar13 * 4 + 0xc) = uVar4;
                        }
                      }
                      else if (iVar34 == 4) {
                        *(undefined1 (*) [16])*pauVar29 = auVar64;
                        *(undefined1 (*) [16])(*pauVar29 + lVar32 * 4) = auVar56;
                        if (iVar22 < iVar19) {
                          *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar55;
                          *(undefined1 (*) [16])(*pauVar29 + lVar32 * 4 + 0x10) = auVar46;
                        }
                        if (iVar23 < iVar19) {
                          *(undefined1 (*) [16])pauVar29[1] = auVar50;
                          *(undefined1 (*) [16])(pauVar29[1] + lVar32 * 4) = auVar44;
                        }
                        if (iVar20 < iVar19) {
                          *(undefined1 (*) [16])(pauVar29[1] + 0x10) = auVar45;
                          *(undefined1 (*) [16])(pauVar29[1] + lVar32 * 4 + 0x10) = auVar41;
                        }
                      }
                      else if (iVar34 == 8) {
                        *pauVar29 = auVar68;
                        if (iVar22 < iVar19) {
                          pauVar29[1] = auVar62;
                        }
                        if (iVar23 < iVar19) {
                          pauVar29[2] = auVar54;
                        }
                        if (iVar20 < iVar19) {
                          pauVar29[3] = auVar49;
                        }
                      }
                      pauVar29 = (undefined1 (*) [32])(*pauVar29 + (long)local_560 * 4);
                    }
                    lVar17 = lVar17 + 1;
                    pfVar27 = pfVar27 + 0x30;
                  } while (lVar17 != 4);
                  pvVar9 = (void *)((long)local_570 + 1U);
                  pvVar7 = (void *)((long)local_568 + 0x20);
                } while ((void *)((long)local_570 + 1U) != local_4e8);
              }
              pvVar9 = (void *)((long)local_4a8 + 8);
              local_4f8 = (ulong)(uint)((int)local_4f8 + iVar30 * 0x120);
              uVar36 = local_4f0;
            } while ((long)local_4a8 + 0xfU < local_370);
          }
          iVar30 = (int)uVar36;
          uVar40 = iVar30 * 4;
          local_4c0 = (ulong)uVar40;
          if ((int)((uint)pvVar9 | 3) < (int)uVar38) {
            local_4e8 = (void *)((long)local_588 + local_508 * 4);
            lVar11 = (long)(int)(uVar35 * 2);
            lVar12 = (long)(int)(uVar35 * 3);
            local_5a0 = (void *)(long)(iVar34 * iVar19);
            local_578 = (void *)CONCAT44(local_578._4_4_,(uint)pvVar9 * iVar30 * 0x24);
            local_4e0 = (void *)CONCAT44(local_4e0._4_4_,iVar30 * 0x90);
            local_4f8 = (long)(int)uVar40 * 4;
            local_4a8 = (void *)((long)(iVar30 * 8) * 4);
            local_3f0 = (long)(iVar30 * 0xc) * 4;
            local_3f8 = (long)(iVar30 * 0x10) * 4;
            local_400 = (long)(iVar30 * 0x14) * 4;
            lVar10 = (long)(int)uVar35;
            local_568 = (void *)(uVar36 & 0xffffffff);
            auVar114 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
            pvVar9 = (void *)((ulong)pvVar9 & 0xffffffff);
            do {
              local_570 = pvVar9;
              if (local_588 == (void *)0x0) {
                fVar43 = 0.0;
                fVar63 = 0.0;
                fVar69 = 0.0;
                fVar106 = 0.0;
              }
              else {
                pfVar27 = (float *)((long)local_4e8 + (long)local_570 * 4);
                fVar43 = *pfVar27;
                fVar63 = pfVar27[1];
                fVar69 = pfVar27[2];
                fVar106 = pfVar27[3];
              }
              if (0 < (int)uVar36) {
                lVar13 = (long)(int)local_578;
                local_560 = (void *)(long)(((int)local_4b0 + (int)local_570) / iVar34);
                pvVar9 = (void *)0x0;
                uVar18 = 0;
                do {
                  local_590 = uVar18;
                  local_598 = pvVar9;
                  iVar20 = iVar15 + (int)local_598;
                  lVar21 = (long)local_4a0.data + local_590;
                  lVar32 = -0x60;
                  do {
                    auVar41 = *(undefined1 (*) [16])(lVar21 + local_4f8 + lVar13 * 4);
                    auVar44 = *(undefined1 (*) [16])((long)local_4a8 + lVar21 + lVar13 * 4);
                    auVar45 = *(undefined1 (*) [16])(lVar21 + local_3f0 + lVar13 * 4);
                    auVar50 = *(undefined1 (*) [16])(lVar21 + local_3f8 + lVar13 * 4);
                    fVar71 = auVar44._0_4_ + auVar41._0_4_;
                    fVar76 = auVar44._4_4_ + auVar41._4_4_;
                    fVar78 = auVar44._8_4_ + auVar41._8_4_;
                    fVar80 = auVar44._12_4_ + auVar41._12_4_;
                    fVar86 = auVar50._0_4_ + auVar45._0_4_;
                    fVar90 = auVar50._4_4_ + auVar45._4_4_;
                    fVar93 = auVar50._8_4_ + auVar45._8_4_;
                    fVar96 = auVar50._12_4_ + auVar45._12_4_;
                    auVar41 = vsubps_avx(auVar41,auVar44);
                    auVar44 = vsubps_avx(auVar45,auVar50);
                    pfVar27 = (float *)(lVar21 + lVar13 * 4);
                    auVar56._0_4_ = fVar71 + *pfVar27 + fVar86;
                    auVar56._4_4_ = fVar76 + pfVar27[1] + fVar90;
                    auVar56._8_4_ = fVar78 + pfVar27[2] + fVar93;
                    auVar56._12_4_ = fVar80 + pfVar27[3] + fVar96;
                    fVar105 = auVar44._0_4_ * 1.4142135;
                    fVar109 = auVar44._4_4_ * 1.4142135;
                    fVar110 = auVar44._8_4_ * 1.4142135;
                    fVar70 = auVar44._12_4_ * 1.4142135;
                    in_ZMM7 = ZEXT1664(CONCAT412(fVar70,CONCAT48(fVar110,CONCAT44(fVar109,fVar105)))
                                      );
                    auVar65._0_4_ = fVar105 + auVar41._0_4_ * 0.70710677;
                    auVar65._4_4_ = fVar109 + auVar41._4_4_ * 0.70710677;
                    auVar65._8_4_ = fVar110 + auVar41._8_4_ * 0.70710677;
                    auVar65._12_4_ = fVar70 + auVar41._12_4_ * 0.70710677;
                    auVar72._0_4_ = fVar86 + fVar86 + auVar112._0_4_ * fVar71;
                    auVar72._4_4_ = fVar90 + fVar90 + auVar112._4_4_ * fVar76;
                    auVar72._8_4_ = fVar93 + fVar93 + auVar112._8_4_ * fVar78;
                    auVar72._12_4_ = fVar96 + fVar96 + auVar112._12_4_ * fVar80;
                    pfVar27 = (float *)(lVar21 + local_400 + lVar13 * 4);
                    auVar46._0_4_ = auVar41._0_4_ * 0.35355338 + *pfVar27 + auVar44._0_4_ * 2.828427
                    ;
                    auVar46._4_4_ =
                         auVar41._4_4_ * 0.35355338 + pfVar27[1] + auVar44._4_4_ * 2.828427;
                    auVar46._8_4_ =
                         auVar41._8_4_ * 0.35355338 + pfVar27[2] + auVar44._8_4_ * 2.828427;
                    auVar46._12_4_ =
                         auVar41._12_4_ * 0.35355338 + pfVar27[3] + auVar44._12_4_ * 2.828427;
                    *(undefined1 (*) [16])((long)local_300 + lVar32) = auVar56;
                    *(undefined1 (*) [16])((long)auStack_2a0 + lVar32) = auVar65;
                    *(undefined1 (*) [16])(auStack_240 + lVar32) = auVar72;
                    *(undefined1 (*) [16])(auStack_1e0 + lVar32) = auVar46;
                    lVar21 = lVar21 + (long)(iVar30 * 0x18) * 4;
                    lVar32 = lVar32 + 0x10;
                  } while (lVar32 != 0);
                  iVar16 = iVar20 % local_57c;
                  uVar8 = iVar20 / local_57c << 2;
                  pauVar33 = (undefined1 (*) [16])
                             ((long)local_4d8->data +
                             (long)(iVar16 * 4 * iVar34) * 4 +
                             (long)local_4d8->w * local_4d8->elemsize * (long)(int)uVar8 +
                             local_4d8->cstep * (long)local_560 * local_4d8->elemsize);
                  iVar20 = iVar16 * 4 + 1;
                  iVar22 = iVar16 * 4 + 2;
                  iVar16 = iVar16 * 4 + 3;
                  pfVar27 = afStack_318 + 2;
                  lVar21 = 0;
                  auVar114 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
                  do {
                    if ((int)(uVar8 | (uint)lVar21) < iVar39) {
                      auVar41 = *(undefined1 (*) [16])(pfVar27 + -0x10);
                      auVar44 = *(undefined1 (*) [16])(pfVar27 + -0xc);
                      auVar45 = *(undefined1 (*) [16])(pfVar27 + -8);
                      auVar50 = *(undefined1 (*) [16])(pfVar27 + -4);
                      fVar71 = auVar44._0_4_ + auVar41._0_4_;
                      fVar76 = auVar44._4_4_ + auVar41._4_4_;
                      fVar78 = auVar44._8_4_ + auVar41._8_4_;
                      fVar80 = auVar44._12_4_ + auVar41._12_4_;
                      fVar86 = auVar50._0_4_ + auVar45._0_4_;
                      fVar90 = auVar50._4_4_ + auVar45._4_4_;
                      fVar93 = auVar50._8_4_ + auVar45._8_4_;
                      fVar96 = auVar50._12_4_ + auVar45._12_4_;
                      auVar41 = vsubps_avx(auVar41,auVar44);
                      auVar44 = vsubps_avx(auVar45,auVar50);
                      in_ZMM7 = ZEXT1664(auVar44);
                      auVar66._0_4_ = fVar43 + pfVar27[-0x14] + fVar71 + fVar86;
                      auVar66._4_4_ = fVar63 + pfVar27[-0x13] + fVar76 + fVar90;
                      auVar66._8_4_ = fVar69 + pfVar27[-0x12] + fVar78 + fVar93;
                      auVar66._12_4_ = fVar106 + pfVar27[-0x11] + fVar80 + fVar96;
                      auVar57._0_4_ =
                           fVar43 + auVar41._0_4_ * 0.70710677 + auVar44._0_4_ * 1.4142135;
                      auVar57._4_4_ =
                           fVar63 + auVar41._4_4_ * 0.70710677 + auVar44._4_4_ * 1.4142135;
                      auVar57._8_4_ =
                           fVar69 + auVar41._8_4_ * 0.70710677 + auVar44._8_4_ * 1.4142135;
                      auVar57._12_4_ =
                           fVar106 + auVar41._12_4_ * 0.70710677 + auVar44._12_4_ * 1.4142135;
                      auVar51._0_4_ = auVar112._0_4_ * fVar71 + fVar43 + fVar86 + fVar86;
                      auVar51._4_4_ = auVar112._4_4_ * fVar76 + fVar63 + fVar90 + fVar90;
                      auVar51._8_4_ = auVar112._8_4_ * fVar78 + fVar69 + fVar93 + fVar93;
                      auVar51._12_4_ = auVar112._12_4_ * fVar80 + fVar106 + fVar96 + fVar96;
                      auVar47._0_4_ =
                           fVar43 + auVar41._0_4_ * 0.35355338 + *pfVar27 + auVar44._0_4_ * 2.828427
                      ;
                      auVar47._4_4_ =
                           fVar63 + auVar41._4_4_ * 0.35355338 + pfVar27[1] +
                           auVar44._4_4_ * 2.828427;
                      auVar47._8_4_ =
                           fVar69 + auVar41._8_4_ * 0.35355338 + pfVar27[2] +
                           auVar44._8_4_ * 2.828427;
                      auVar47._12_4_ =
                           fVar106 + auVar41._12_4_ * 0.35355338 + pfVar27[3] +
                           auVar44._12_4_ * 2.828427;
                      if (iVar34 == 1) {
                        *(float *)*pauVar33 = auVar66._0_4_;
                        uVar4 = vextractps_avx(auVar66,1);
                        *(undefined4 *)(*pauVar33 + lVar10 * 4) = uVar4;
                        uVar4 = vextractps_avx(auVar66,2);
                        *(undefined4 *)(*pauVar33 + lVar11 * 4) = uVar4;
                        uVar4 = vextractps_avx(auVar66,3);
                        *(undefined4 *)(*pauVar33 + lVar12 * 4) = uVar4;
                        if (iVar20 < iVar19) {
                          *(float *)(*pauVar33 + 4) = auVar57._0_4_;
                          uVar4 = vextractps_avx(auVar57,1);
                          *(undefined4 *)(*pauVar33 + lVar10 * 4 + 4) = uVar4;
                          uVar4 = vextractps_avx(auVar57,2);
                          *(undefined4 *)(*pauVar33 + lVar11 * 4 + 4) = uVar4;
                          uVar4 = vextractps_avx(auVar57,3);
                          *(undefined4 *)(*pauVar33 + lVar12 * 4 + 4) = uVar4;
                        }
                        if (iVar22 < iVar19) {
                          *(float *)(*pauVar33 + 8) = auVar51._0_4_;
                          uVar4 = vextractps_avx(auVar51,1);
                          *(undefined4 *)(*pauVar33 + lVar10 * 4 + 8) = uVar4;
                          uVar4 = vextractps_avx(auVar51,2);
                          *(undefined4 *)(*pauVar33 + lVar11 * 4 + 8) = uVar4;
                          uVar4 = vextractps_avx(auVar51,3);
                          *(undefined4 *)(*pauVar33 + lVar12 * 4 + 8) = uVar4;
                        }
                        if (iVar16 < iVar19) {
                          *(float *)(*pauVar33 + 0xc) = auVar47._0_4_;
                          uVar4 = vextractps_avx(auVar47,1);
                          *(undefined4 *)(*pauVar33 + lVar10 * 4 + 0xc) = uVar4;
                          uVar4 = vextractps_avx(auVar47,2);
                          *(undefined4 *)(*pauVar33 + lVar11 * 4 + 0xc) = uVar4;
                          uVar4 = vextractps_avx(auVar47,3);
                          *(undefined4 *)(*pauVar33 + lVar12 * 4 + 0xc) = uVar4;
                        }
                      }
                      else if (iVar34 == 4) {
                        *pauVar33 = auVar66;
                        if (iVar20 < iVar19) {
                          pauVar33[1] = auVar57;
                        }
                        if (iVar22 < iVar19) {
                          pauVar33[2] = auVar51;
                        }
                        if (iVar16 < iVar19) {
                          pauVar33[3] = auVar47;
                        }
                      }
                      pauVar33 = (undefined1 (*) [16])(*pauVar33 + (long)local_5a0 * 4);
                    }
                    lVar21 = lVar21 + 1;
                    pfVar27 = pfVar27 + 0x18;
                  } while (lVar21 != 4);
                  pvVar9 = (void *)((long)local_598 + 1U);
                  uVar18 = local_590 + 0x10;
                } while ((void *)((long)local_598 + 1U) != local_568);
              }
              pvVar9 = (void *)((long)local_570 + 4);
              local_578 = (void *)CONCAT44(local_578._4_4_,(int)local_578 + iVar30 * 0x90);
              uVar36 = local_4f0;
            } while ((long)((long)local_570 + 7U) < (long)local_3e8);
          }
          else {
            auVar114 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
          }
          if ((int)((uint)pvVar9 | 1) < (int)uVar38) {
            local_578 = local_4a0.data;
            iVar20 = (int)uVar36;
            iVar34 = local_4d8->w;
            local_4e0 = local_4d8->data;
            sVar5 = local_4d8->elemsize;
            local_4e8 = (void *)(local_4d8->cstep * sVar5);
            local_560 = (void *)CONCAT44(local_560._4_4_,(uint)pvVar9 * iVar20 * 0x24);
            local_568 = (void *)((long)local_588 + local_508 * 4);
            local_590 = uVar36 & 0xffffffff;
            local_570 = (void *)CONCAT44(local_570._4_4_,iVar20 * 0x48);
            pvVar9 = (void *)((ulong)pvVar9 & 0xffffffff);
            do {
              local_598 = pvVar9;
              fVar43 = 0.0;
              auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
              if (local_588 != (void *)0x0) {
                auVar121 = ZEXT464(*(uint *)((long)local_568 + (long)local_598 * 4));
                fVar43 = *(float *)((long)local_568 + (long)local_598 * 4 + 4);
              }
              if (0 < (int)uVar36) {
                puVar25 = (undefined8 *)((long)local_4a0.data + (long)(int)local_560 * 4);
                local_5a0 = (void *)((local_508 + (long)local_598) * (long)local_4e8 +
                                    (long)local_4e0);
                uVar18 = 0;
                do {
                  iVar16 = iVar15 + (int)uVar18;
                  lVar10 = -0x30;
                  puVar26 = puVar25;
                  do {
                    uVar36 = *(ulong *)((long)puVar26 + (long)(iVar20 * 2) * 4);
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = uVar36;
                    uVar37 = *(ulong *)((long)puVar26 + (long)(int)uVar40 * 4);
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = uVar37;
                    fVar63 = (float)uVar37 + (float)uVar36;
                    fVar69 = (float)(uVar37 >> 0x20) + (float)(uVar36 >> 0x20);
                    uVar36 = *(ulong *)((long)puVar26 + (long)(iVar20 * 6) * 4);
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar36;
                    uVar37 = *(ulong *)((long)puVar26 + (long)(iVar20 * 8) * 4);
                    auVar87._8_8_ = 0;
                    auVar87._0_8_ = uVar37;
                    fVar106 = (float)uVar37 + (float)uVar36;
                    fVar71 = (float)(uVar37 >> 0x20) + (float)(uVar36 >> 0x20);
                    in_ZMM7 = ZEXT864(CONCAT44(fVar71,fVar106));
                    auVar111._0_4_ = fVar106 + fVar63 + (float)*puVar26;
                    auVar111._4_4_ = fVar71 + fVar69 + (float)((ulong)*puVar26 >> 0x20);
                    auVar111._8_8_ = 0;
                    uVar2 = vmovlps_avx(auVar111);
                    *(undefined8 *)((long)afStack_330 + lVar10) = uVar2;
                    auVar41 = vinsertps_avx(auVar73,auVar52,0x50);
                    auVar44 = vinsertps_avx(auVar87,auVar58,0x50);
                    auVar45 = vsubps_avx(auVar41,auVar44);
                    auVar41 = vinsertps_avx(auVar52,auVar73,0x50);
                    auVar44 = vinsertps_avx(auVar58,auVar87,0x50);
                    auVar41 = vsubps_avx(auVar41,auVar44);
                    auVar59._0_4_ = auVar114._0_4_ * auVar41._0_4_ + auVar45._0_4_ * 1.4142135;
                    auVar59._4_4_ = auVar114._4_4_ * auVar41._4_4_ + auVar45._4_4_ * 0.70710677;
                    auVar59._8_4_ = auVar114._8_4_ * auVar41._8_4_ + auVar45._8_4_ * 0.0;
                    auVar59._12_4_ = auVar114._12_4_ * auVar41._12_4_ + auVar45._12_4_ * 0.0;
                    uVar2 = vmovlps_avx(auVar59);
                    *(undefined8 *)((long)local_300 + lVar10) = uVar2;
                    auVar60._0_4_ = fVar106 + fVar106 + auVar112._0_4_ * fVar63;
                    auVar60._4_4_ = fVar71 + fVar71 + auVar112._4_4_ * fVar69;
                    auVar60._8_4_ = auVar112._8_4_ * 0.0 + 0.0;
                    auVar60._12_4_ = auVar112._12_4_ * 0.0 + 0.0;
                    uVar2 = vmovlps_avx(auVar60);
                    *(undefined8 *)((long)auStack_2d0 + lVar10) = uVar2;
                    uVar2 = *(undefined8 *)((long)puVar26 + (long)(iVar20 * 10) * 4);
                    auVar53._0_4_ =
                         auVar41._0_4_ * SUB164(ZEXT816(0x403504f33eb504f3),0) +
                         auVar45._0_4_ * 2.828427 + (float)uVar2;
                    auVar53._4_4_ =
                         auVar41._4_4_ * SUB164(ZEXT816(0x403504f33eb504f3),4) +
                         auVar45._4_4_ * 0.35355338 + (float)((ulong)uVar2 >> 0x20);
                    auVar53._8_4_ = auVar41._8_4_ * 0.0 + auVar45._8_4_ * 0.0 + 0.0;
                    auVar53._12_4_ = auVar41._12_4_ * 0.0 + auVar45._12_4_ * 0.0 + 0.0;
                    uVar2 = vmovlps_avx(auVar53);
                    *(undefined8 *)((long)auStack_2a0 + lVar10) = uVar2;
                    puVar26 = (undefined8 *)((long)puVar26 + (long)(iVar30 * 0xc) * 4);
                    lVar10 = lVar10 + 8;
                  } while (lVar10 != 0);
                  iVar22 = iVar16 % local_57c;
                  uVar8 = iVar16 / local_57c << 2;
                  pfVar27 = (float *)((long)local_5a0 +
                                     (long)(iVar22 * 4) * 4 +
                                     (long)(int)uVar8 * (long)iVar34 * sVar5);
                  pfVar28 = &fStack_334;
                  lVar10 = 0;
                  auVar112 = ZEXT1664(auVar112._0_16_);
                  auVar122 = auVar121;
                  do {
                    auVar121 = auVar122;
                    if ((int)(uVar8 | (uint)lVar10) < iVar39) {
                      fVar71 = pfVar28[-7] + pfVar28[-9];
                      fVar76 = pfVar28[-6] + pfVar28[-8];
                      fVar78 = pfVar28[-3] + pfVar28[-5];
                      fVar80 = pfVar28[-2] + pfVar28[-4];
                      fVar86 = pfVar28[-9] - pfVar28[-7];
                      fVar90 = pfVar28[-8] - pfVar28[-6];
                      fVar93 = pfVar28[-5] - pfVar28[-3];
                      auVar121 = ZEXT1664(auVar122._0_16_);
                      fVar96 = pfVar28[-4] - pfVar28[-2];
                      fVar105 = auVar122._0_4_;
                      fVar63 = pfVar28[-10];
                      fVar69 = pfVar28[-1];
                      fVar106 = *pfVar28;
                      *pfVar27 = fVar78 + fVar105 + pfVar28[-0xb] + fVar71;
                      pfVar27[(int)uVar35] = fVar43 + fVar63 + fVar76 + fVar80;
                      if (iVar22 * 4 + 1 < iVar19) {
                        pfVar27[1] = fVar86 * 0.70710677 + fVar105 + fVar93 * 1.4142135;
                        pfVar27[(long)(int)uVar35 + 1] =
                             fVar90 * 0.70710677 + fVar43 + fVar96 * 1.4142135;
                      }
                      if (iVar22 * 4 + 2 < iVar19) {
                        pfVar27[2] = fVar105 + fVar78 + fVar78 + fVar71 * 0.5;
                        pfVar27[(long)(int)uVar35 + 2] = fVar76 * 0.5 + fVar43 + fVar80 + fVar80;
                      }
                      in_ZMM7 = ZEXT464(0);
                      if (iVar22 * 4 + 3 < iVar19) {
                        pfVar27[3] = fVar105 + fVar86 * 0.35355338 + fVar69 + fVar93 * 2.828427;
                        pfVar27[(long)(int)uVar35 + 3] =
                             fVar90 * 0.35355338 + fVar43 + fVar106 + fVar96 * 2.828427;
                      }
                      pfVar27 = pfVar27 + iVar19;
                      auVar112 = ZEXT1664(CONCAT412(0x3f000000,
                                                    CONCAT48(0x3f000000,0x3f0000003f000000)));
                      auVar114 = ZEXT1664(ZEXT816(0x3fb504f33f3504f3));
                    }
                    lVar10 = lVar10 + 1;
                    pfVar28 = pfVar28 + 0xc;
                    auVar122 = auVar121;
                  } while (lVar10 != 4);
                  uVar18 = uVar18 + 1;
                  puVar25 = puVar25 + 1;
                } while (uVar18 != local_590);
              }
              pvVar9 = (void *)((long)local_598 + 2);
              local_560 = (void *)CONCAT44(local_560._4_4_,(int)local_560 + iVar20 * 0x48);
              uVar36 = local_4f0;
            } while ((long)((long)local_598 + 3U) < (long)local_3e8);
          }
          iVar34 = (int)pvVar9;
          if (iVar34 < (int)uVar38) {
            local_598 = (void *)CONCAT44(local_598._4_4_,iVar30 * 0x24);
            local_560 = local_4a0.data;
            iVar22 = (int)uVar36;
            local_5a0 = (void *)(long)iVar22;
            iVar20 = local_4d8->w;
            local_568 = local_4d8->data;
            sVar5 = local_4d8->elemsize;
            local_570 = (void *)(local_4d8->cstep * sVar5);
            iVar16 = iVar34 * iVar22 * 0x24;
            local_578 = (void *)((long)local_588 + local_508 * 4);
            uVar18 = (long)iVar34;
            uVar37 = uVar36;
            do {
              local_590 = uVar18;
              if (local_588 == (void *)0x0) {
                fVar43 = 0.0;
              }
              else {
                fVar43 = *(float *)((long)local_578 + local_590 * 4);
              }
              if (0 < (int)uVar37) {
                pfVar27 = (float *)((long)local_4a0.data + (long)iVar16 * 4);
                uVar18 = 0;
                do {
                  iVar34 = iVar15 + (int)uVar18;
                  lVar10 = -0x18;
                  in_ZMM7 = ZEXT464(0x3eb504f3);
                  pfVar28 = pfVar27;
                  do {
                    fVar63 = pfVar28[iVar22 * 2] + pfVar28[(long)local_5a0];
                    fVar69 = pfVar28[(int)uVar40] + pfVar28[iVar22 * 3];
                    fVar106 = pfVar28[(long)local_5a0] - pfVar28[iVar22 * 2];
                    fVar71 = pfVar28[iVar22 * 3] - pfVar28[(int)uVar40];
                    *(float *)((long)afStack_348 + lVar10) = fVar63 + *pfVar28 + fVar69;
                    *(float *)((long)afStack_330 + lVar10) =
                         fVar71 * 1.4142135 + fVar106 * 0.70710677;
                    *(float *)((long)afStack_318 + lVar10) = fVar69 + fVar69 + fVar63 * 0.5;
                    *(float *)((long)local_300 + lVar10) =
                         fVar71 * 2.828427 + fVar106 * 0.35355338 + pfVar28[iVar22 * 5];
                    pfVar28 = pfVar28 + iVar22 * 6;
                    lVar10 = lVar10 + 4;
                  } while (lVar10 != 0);
                  iVar23 = iVar34 % local_57c;
                  uVar35 = iVar34 / local_57c << 2;
                  pfVar28 = (float *)((long)local_568 +
                                     (long)(iVar23 * 4) * 4 +
                                     (long)(int)uVar35 * (long)iVar20 * sVar5 +
                                     (local_508 + local_590) * (long)local_570);
                  pfVar31 = (float *)(local_360 + 0x14);
                  lVar10 = 0;
                  do {
                    if ((int)(uVar35 | (uint)lVar10) < iVar39) {
                      fVar69 = pfVar31[-3] + pfVar31[-4];
                      in_ZMM7 = ZEXT464((uint)fVar69);
                      fVar106 = pfVar31[-1] + pfVar31[-2];
                      fVar71 = pfVar31[-4] - pfVar31[-3];
                      fVar76 = pfVar31[-2] - pfVar31[-1];
                      fVar63 = *pfVar31;
                      *pfVar28 = fVar43 + pfVar31[-5] + fVar69 + fVar106;
                      if (iVar23 * 4 + 1 < iVar19) {
                        pfVar28[1] = fVar43 + fVar71 * 0.70710677 + fVar76 * 1.4142135;
                      }
                      if (iVar23 * 4 + 2 < iVar19) {
                        pfVar28[2] = fVar69 * 0.5 + fVar43 + fVar106 + fVar106;
                      }
                      auVar112 = ZEXT1664(CONCAT412(0x3f000000,
                                                    CONCAT48(0x3f000000,0x3f0000003f000000)));
                      if (iVar23 * 4 + 3 < iVar19) {
                        pfVar28[3] = fVar43 + fVar71 * 0.35355338 + fVar63 + fVar76 * 2.828427;
                      }
                      pfVar28 = pfVar28 + iVar19;
                    }
                    lVar10 = lVar10 + 1;
                    pfVar31 = pfVar31 + 6;
                  } while (lVar10 != 4);
                  uVar18 = uVar18 + 1;
                  pfVar27 = pfVar27 + 1;
                } while (uVar18 != (uVar36 & 0xffffffff));
              }
              iVar16 = iVar16 + iVar30 * 0x24;
              uVar18 = local_590 + 1;
              uVar37 = local_4f0;
            } while (local_590 + 1 != local_3e8);
          }
          uVar18 = (ulong)(iVar15 + local_5a4);
        } while ((int)(iVar15 + local_5a4) < (int)local_4c8);
      }
      piVar6 = (int *)CONCAT44(local_4a0.refcount._4_4_,local_4a0.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_4a0.allocator == (Allocator *)0x0) {
            if (local_4a0.data != (void *)0x0) {
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              free(local_4a0.data);
            }
          }
          else {
            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
            (*(local_4a0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_4a0.cstep = 0;
      local_4a0.data = (void *)0x0;
      local_4a0.refcount._0_4_ = 0;
      local_4a0.refcount._4_4_ = 0;
      local_4a0.elemsize = 0;
      local_4a0.elempack = 0;
      local_4a0.dims = 0;
      local_4a0.w = 0;
      local_4a0.h = 0;
      local_4a0.d = 0;
      local_4a0.c = 0;
      local_558 = local_558 + 1;
    } while (local_558 != local_4cc);
  }
  piVar6 = (int *)CONCAT44(local_550.refcount._4_4_,local_550.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_550.allocator == (Allocator *)0x0) {
        if (local_550.data != (void *)0x0) {
          free(local_550.data);
        }
      }
      else {
        (*(local_550.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_550.cstep = 0;
  local_550.data = (void *)0x0;
  local_550.refcount._0_4_ = 0;
  local_550.refcount._4_4_ = 0;
  local_550.elemsize = 0;
  local_550.elempack = 0;
  local_550.dims = 0;
  local_550.w = 0;
  local_550.h = 0;
  local_550.d = 0;
  local_550.c = 0;
  piVar6 = (int *)CONCAT44(local_450.refcount._4_4_,local_450.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_450.allocator == (Allocator *)0x0) {
        if (local_450.data != (void *)0x0) {
          free(local_450.data);
        }
      }
      else {
        (*(local_450.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}